

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigPrintSimClasses(Ivy_FraigMan_t *p)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t *pIVar2;
  int Counter;
  ulong uVar3;
  
  for (pIVar1 = (p->lClasses).pHead; pIVar1 != (Ivy_Obj_t *)0x0; pIVar1 = pIVar1->pPrevFan0) {
    uVar3 = 0;
    pIVar2 = pIVar1;
    do {
      uVar3 = (ulong)((int)uVar3 + 1);
      pIVar2 = pIVar2->pNextFan1;
    } while (pIVar2 != (Ivy_Obj_t *)0x0);
    printf("%d ",uVar3);
  }
  return;
}

Assistant:

void Ivy_FraigPrintSimClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pClass;
    Ivy_FraigForEachEquivClass( p->lClasses.pHead, pClass )
    {
//        Ivy_FraigPrintClass( pClass );
        printf( "%d ", Ivy_FraigCountClassNodes( pClass ) );
    }
//    printf( "\n" );
}